

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

cmpResult __thiscall llvm::detail::DoubleAPFloat::compare(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  type pAVar1;
  type pAVar2;
  cmpResult Result;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,0);
  pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&RHS->Floats,0);
  this_local._4_4_ = APFloat::compare(pAVar1,pAVar2);
  if (this_local._4_4_ == cmpEqual) {
    pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,1);
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&RHS->Floats,1);
    this_local._4_4_ = APFloat::compare(pAVar1,pAVar2);
  }
  return this_local._4_4_;
}

Assistant:

APFloat::cmpResult DoubleAPFloat::compare(const DoubleAPFloat &RHS) const {
  auto Result = Floats[0].compare(RHS.Floats[0]);
  // |Float[0]| > |Float[1]|
  if (Result == APFloat::cmpEqual)
    return Floats[1].compare(RHS.Floats[1]);
  return Result;
}